

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void google::protobuf::internal::MapMergeFrom<long,proto2_unittest::Proto2MapEnum>
               (Map<long,_proto2_unittest::Proto2MapEnum> *dest,
               Map<long,_proto2_unittest::Proto2MapEnum> *src)

{
  Proto2MapEnum PVar1;
  Proto2MapEnum *pPVar2;
  const_iterator __begin0;
  UntypedMapIterator local_30;
  
  UntypedMapBase::begin(&local_30,(UntypedMapBase *)src);
  while (local_30.node_ != (NodeBase *)0x0) {
    PVar1 = *(Proto2MapEnum *)&local_30.node_[2].next;
    pPVar2 = Map<long,_proto2_unittest::Proto2MapEnum>::operator[]<long>
                       (dest,(key_arg<long> *)(local_30.node_ + 1));
    *pPVar2 = PVar1;
    UntypedMapIterator::PlusPlus(&local_30);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}